

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testiconv.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  void *__ptr;
  void *__ptr_00;
  void *__s1;
  char *pcVar5;
  long lVar6;
  char buffer [8192];
  
  if (argc < 2) {
    pcVar5 = "utf8.txt";
  }
  else {
    pcVar5 = argv[1];
  }
  __stream = fopen(pcVar5,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Unable to open %s\n",pcVar5);
    iVar2 = 1;
  }
  else {
    uVar3 = 0;
    while( true ) {
      pcVar5 = fgets(buffer,0x2000,__stream);
      if (pcVar5 == (char *)0x0) break;
      sVar4 = strlen(buffer);
      __ptr = (void *)SDL_iconv_string("UCS-4","UTF-8",buffer,sVar4 + 1);
      for (sVar4 = 4; *(int *)((long)__ptr + (sVar4 - 4)) != 0; sVar4 = sVar4 + 4) {
      }
      for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 8) {
        uVar1 = *(undefined8 *)((long)&PTR_anon_var_dwarf_27_00103d60 + lVar6);
        __ptr_00 = (void *)SDL_iconv_string(uVar1,"UCS-4",__ptr,sVar4);
        __s1 = (void *)SDL_iconv_string("UCS-4",uVar1,__ptr_00,sVar4);
        if (__s1 == (void *)0x0) {
LAB_001012e1:
          fprintf(_stderr,"FAIL: %s\n",uVar1);
          uVar3 = uVar3 + 1;
        }
        else {
          iVar2 = bcmp(__s1,__ptr,sVar4);
          if (iVar2 != 0) goto LAB_001012e1;
        }
        free(__ptr_00);
        free(__s1);
      }
      pcVar5 = (char *)SDL_iconv_string("UTF-8","UCS-4",__ptr,sVar4);
      free(__ptr);
      fputs(pcVar5,_stdout);
      free(pcVar5);
    }
    fprintf(_stderr,"\nTotal errors: %d\n",(ulong)uVar3);
    iVar2 = uVar3 + 1;
    if (uVar3 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	const char * formats[] = {
		"UTF8",
		"UTF-8",
		"UTF16BE",
		"UTF-16BE",
		"UTF16LE",
		"UTF-16LE",
		"UTF32BE",
		"UTF-32BE",
		"UTF32LE",
		"UTF-32LE",
		"UCS4",
		"UCS-4",
	};

	const char * fname;
	char buffer[BUFSIZ];
	char *ucs4;
	char *test[2];
	int i;
	FILE *file;
	int errors = 0;

	fname = (argc < 2) ? "utf8.txt" : argv[1];
	file = fopen(fname, "rb");
	if ( !file ) {
		fprintf(stderr, "Unable to open %s\n", fname);
		return (1);
	}

	while ( fgets(buffer, sizeof(buffer), file) ) {
		/* Convert to UCS-4 */
		size_t len;
		ucs4 = SDL_iconv_string("UCS-4", "UTF-8", buffer, SDL_strlen(buffer)+1);
		len = (widelen(ucs4)+1)*4;
		for ( i = 0; i < SDL_arraysize(formats); ++i ) {
			test[0] = SDL_iconv_string(formats[i], "UCS-4", ucs4, len);
			test[1] = SDL_iconv_string("UCS-4", formats[i], test[0], len);
			if ( !test[1] || SDL_memcmp(test[1], ucs4, len) != 0 ) {
				fprintf(stderr, "FAIL: %s\n", formats[i]);
				++errors;
			}
			if ( test[0] ) {
				SDL_free(test[0]);
			}
			if ( test[1] ) {
				SDL_free(test[1]);
			}
		}
		test[0] = SDL_iconv_string("UTF-8", "UCS-4", ucs4, len);
		SDL_free(ucs4);
		fputs(test[0], stdout);
		SDL_free(test[0]);
	}

	fprintf(stderr, "\nTotal errors: %d\n", errors);
	return (errors ? errors + 1 : 0);
}